

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNotationImpl.cpp
# Opt level: O3

void __thiscall xercesc_4_0::DOMNotationImpl::setBaseURI(DOMNotationImpl *this,XMLCh *baseURI)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLCh *target;
  long lVar3;
  long *plVar4;
  
  if ((baseURI == (XMLCh *)0x0) || (*baseURI == L'\0')) {
    target = (XMLCh *)0x0;
  }
  else {
    iVar2 = (*(this->super_DOMNotation).super_DOMNode._vptr_DOMNode[0xc])(this);
    plVar4 = (long *)(CONCAT44(extraout_var,iVar2) + -8);
    lVar3 = 0x10;
    do {
      lVar1 = lVar3 + -0x10;
      lVar3 = lVar3 + 2;
    } while (*(short *)((long)baseURI + lVar1) != 0);
    if (CONCAT44(extraout_var,iVar2) == 0) {
      plVar4 = (long *)0x0;
    }
    target = (XMLCh *)(**(code **)(*plVar4 + 0x20))();
    XMLString::fixURI(baseURI,target);
  }
  this->fBaseURI = target;
  return;
}

Assistant:

void DOMNotationImpl::setBaseURI(const XMLCh* baseURI) {
    if (baseURI && *baseURI) {
        XMLCh* temp = (XMLCh*) ((DOMDocumentImpl *)getOwnerDocument())->allocate((XMLString::stringLen(baseURI) + 9)*sizeof(XMLCh));
        XMLString::fixURI(baseURI, temp);
        fBaseURI = temp;
    }
    else
        fBaseURI = 0;
}